

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDIOAnalyzer.cpp
# Opt level: O2

bool __thiscall SDIOAnalyzer::FrameStateMachine(SDIOAnalyzer *this)

{
  U32 *pUVar1;
  U8 UVar2;
  U64 UVar3;
  SDIOAnalyzerResults *pSVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  U32 UVar8;
  MarkerType MVar9;
  U32 UVar10;
  ulong uVar11;
  FrameV2 *this_00;
  undefined8 uVar12;
  char *pcVar13;
  bool bVar14;
  int i;
  int iVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  Channel *pCStack_50;
  U64 local_40;
  S64 local_38;
  ulong local_30;
  ulong uStack_28;
  undefined1 local_20;
  undefined1 local_1f;
  
  Frame::Frame((Frame *)&local_40);
  switch(this->frameState) {
  case 0:
    local_40 = this->lastFallingClockEdge;
    local_38 = AnalyzerChannelData::GetSampleOfNextEdge();
    local_1f = 0;
    uVar7 = AnalyzerChannelData::GetBitState();
    local_30 = (ulong)uVar7;
    local_20 = 0;
    AnalyzerResults::AddFrame
              ((Frame *)(this->mResults)._M_t.
                        super___uniq_ptr_impl<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_SDIOAnalyzerResults_*,_std::default_delete<SDIOAnalyzerResults>_>
                        .super__Head_base<0UL,_SDIOAnalyzerResults_*,_false>._M_head_impl);
    FrameV2::AddBoolean((char *)(this->frameV2)._M_t.
                                super___uniq_ptr_impl<FrameV2,_std::default_delete<FrameV2>_>._M_t.
                                super__Tuple_impl<0UL,_FrameV2_*,_std::default_delete<FrameV2>_>.
                                super__Head_base<0UL,_FrameV2_*,_false>._M_head_impl,true);
    this->startingSampleInclusive = local_40;
    iVar15 = AnalyzerChannelData::GetBitState();
    this->isCmd = iVar15 != 0;
    AnalyzerResults::AddMarker
              ((ulonglong)
               (this->mResults)._M_t.
               super___uniq_ptr_impl<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>
               ._M_t.
               super__Tuple_impl<0UL,_SDIOAnalyzerResults_*,_std::default_delete<SDIOAnalyzerResults>_>
               .super__Head_base<0UL,_SDIOAnalyzerResults_*,_false>._M_head_impl,
               (MarkerType)this->lastFallingClockEdge,(Channel *)0x8);
    pSVar4 = (this->mResults)._M_t.
             super___uniq_ptr_impl<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>.
             _M_t.
             super__Tuple_impl<0UL,_SDIOAnalyzerResults_*,_std::default_delete<SDIOAnalyzerResults>_>
             .super__Head_base<0UL,_SDIOAnalyzerResults_*,_false>._M_head_impl;
    if (this->isCmd == true) {
      MVar9 = AnalyzerChannelData::GetSampleNumber();
      pCStack_50 = (Channel *)0xa;
    }
    else {
      MVar9 = AnalyzerChannelData::GetSampleNumber();
      pCStack_50 = (Channel *)0xb;
    }
    AnalyzerResults::AddMarker((ulonglong)pSVar4,MVar9,pCStack_50);
    this->frameState = 1;
    this->frameCounter = 6;
    this->qwordLow = 0;
    this->lastCommand = 0;
    this->expectedCRC = 0;
LAB_00106622:
    this->startOfNextFrame = 0xffffffffffffffff;
    break;
  case 1:
    uVar11 = this->startOfNextFrame;
    if (this->lastFallingClockEdge < this->startOfNextFrame) {
      uVar11 = this->lastFallingClockEdge;
    }
    this->startOfNextFrame = uVar11;
    UVar3 = this->qwordLow;
    uVar7 = AnalyzerChannelData::GetBitState();
    this->qwordLow = (ulong)uVar7 | UVar3 * 2;
    pUVar1 = &this->frameCounter;
    *pUVar1 = *pUVar1 - 1;
    if (*pUVar1 == 0) {
      local_40 = this->startOfNextFrame;
      local_38 = AnalyzerChannelData::GetSampleOfNextEdge();
      local_1f = 0;
      local_30 = (ulong)((uint)this->qwordLow & 0x3f);
      uStack_28 = (ulong)this->isCmd;
      local_20 = 1;
      AnalyzerResults::AddFrame
                ((Frame *)(this->mResults)._M_t.
                          super___uniq_ptr_impl<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_SDIOAnalyzerResults_*,_std::default_delete<SDIOAnalyzerResults>_>
                          .super__Head_base<0UL,_SDIOAnalyzerResults_*,_false>._M_head_impl);
      AnalyzerResults::AddMarker
                ((ulonglong)
                 (this->mResults)._M_t.
                 super___uniq_ptr_impl<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_SDIOAnalyzerResults_*,_std::default_delete<SDIOAnalyzerResults>_>
                 .super__Head_base<0UL,_SDIOAnalyzerResults_*,_false>._M_head_impl,
                 (int)this->startOfNextFrame + ErrorDot,(Channel *)0x0);
      FrameV2::AddByte((char *)(this->frameV2)._M_t.
                               super___uniq_ptr_impl<FrameV2,_std::default_delete<FrameV2>_>._M_t.
                               super__Tuple_impl<0UL,_FrameV2_*,_std::default_delete<FrameV2>_>.
                               super__Head_base<0UL,_FrameV2_*,_false>._M_head_impl,'K');
      FrameV2::AddBoolean((char *)(this->frameV2)._M_t.
                                  super___uniq_ptr_impl<FrameV2,_std::default_delete<FrameV2>_>._M_t
                                  .super__Tuple_impl<0UL,_FrameV2_*,_std::default_delete<FrameV2>_>.
                                  super__Head_base<0UL,_FrameV2_*,_false>._M_head_impl,true);
      UVar10 = (U32)local_30;
      UVar8 = sdCRC7(0,(byte)((int)uStack_28 << 6) | (byte)local_30);
      this->expectedCRC = UVar8;
      this->lastCommand = UVar10;
      if (((this->isCmd == false) && (this->qwordLow < 0xb)) &&
         ((0x604UL >> (this->qwordLow & 0x3f) & 1) != 0)) {
        uVar16 = 3;
        uVar17 = 0x7f;
      }
      else {
        uVar16 = 2;
        uVar17 = 0x20;
      }
      this->byte = '\0';
      this->qwordLow = 0;
      this->byteCounter = 0;
      this->frameState = uVar16;
      this->frameCounter = uVar17;
      goto LAB_00106622;
    }
    break;
  case 2:
    uVar11 = this->startOfNextFrame;
    if (this->lastFallingClockEdge < this->startOfNextFrame) {
      uVar11 = this->lastFallingClockEdge;
    }
    this->startOfNextFrame = uVar11;
    UVar2 = this->byte;
    bVar6 = AnalyzerChannelData::GetBitState();
    this->byte = UVar2 * '\x02' | bVar6;
    UVar3 = this->qwordLow;
    uVar7 = AnalyzerChannelData::GetBitState();
    this->qwordLow = (ulong)uVar7 | UVar3 * 2;
    uVar7 = this->frameCounter - 1;
    this->frameCounter = uVar7;
    if ((uVar7 & 7) == 0) {
      this->data[this->byteCounter] = this->byte;
      this->byteCounter = this->byteCounter + 1;
      this->byte = '\0';
      if (this->frameCounter == 0) {
        local_40 = this->startOfNextFrame;
        local_38 = AnalyzerChannelData::GetSampleOfNextEdge();
        local_1f = (undefined1)this->lastCommand;
        local_30 = this->qwordLow;
        local_20 = 2;
        AnalyzerResults::AddFrame
                  ((Frame *)(this->mResults)._M_t.
                            super___uniq_ptr_impl<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_SDIOAnalyzerResults_*,_std::default_delete<SDIOAnalyzerResults>_>
                            .super__Head_base<0UL,_SDIOAnalyzerResults_*,_false>._M_head_impl);
        AnalyzerResults::AddMarker
                  ((ulonglong)
                   (this->mResults)._M_t.
                   super___uniq_ptr_impl<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_SDIOAnalyzerResults_*,_std::default_delete<SDIOAnalyzerResults>_>
                   .super__Head_base<0UL,_SDIOAnalyzerResults_*,_false>._M_head_impl,
                   (int)this->startOfNextFrame + ErrorDot,(Channel *)0x2);
        FrameV2::AddByteArray
                  ((char *)(this->frameV2)._M_t.
                           super___uniq_ptr_impl<FrameV2,_std::default_delete<FrameV2>_>._M_t.
                           super__Tuple_impl<0UL,_FrameV2_*,_std::default_delete<FrameV2>_>.
                           super__Head_base<0UL,_FrameV2_*,_false>._M_head_impl,(uchar *)"ARG",
                   (ulonglong)this->data);
        uVar11 = local_30;
        UVar10 = this->expectedCRC;
        for (iVar15 = 0x18; -1 < iVar15; iVar15 = iVar15 + -8) {
          UVar10 = sdCRC7(UVar10,(U8)(uVar11 >> ((byte)iVar15 & 0x3f)));
        }
        this->expectedCRC = UVar10;
        uVar12 = 0x700000004;
        goto LAB_00106613;
      }
    }
    break;
  case 3:
    uVar11 = this->startOfNextFrame;
    if (this->lastFallingClockEdge < this->startOfNextFrame) {
      uVar11 = this->lastFallingClockEdge;
    }
    this->startOfNextFrame = uVar11;
    UVar2 = this->byte;
    bVar6 = AnalyzerChannelData::GetBitState();
    this->byte = UVar2 * '\x02' | bVar6;
    UVar3 = this->qwordLow;
    uVar7 = AnalyzerChannelData::GetBitState();
    this->qwordLow = (ulong)uVar7 | UVar3 * 2;
    uVar7 = this->frameCounter - 1;
    this->frameCounter = uVar7;
    if ((uVar7 & 7) == 0) {
      this->data[this->byteCounter] = this->byte;
      uVar7 = this->frameCounter;
    }
    if (uVar7 == 0) {
      local_40 = this->startOfNextFrame;
      local_38 = AnalyzerChannelData::GetSampleOfNextEdge();
      local_1f = (undefined1)this->lastCommand;
      local_30 = this->qwordHigh;
      uStack_28 = this->qwordLow;
      local_20 = 3;
      AnalyzerResults::AddFrame
                ((Frame *)(this->mResults)._M_t.
                          super___uniq_ptr_impl<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_SDIOAnalyzerResults_*,_std::default_delete<SDIOAnalyzerResults>_>
                          .super__Head_base<0UL,_SDIOAnalyzerResults_*,_false>._M_head_impl);
      AnalyzerResults::AddMarker
                ((ulonglong)
                 (this->mResults)._M_t.
                 super___uniq_ptr_impl<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_SDIOAnalyzerResults_*,_std::default_delete<SDIOAnalyzerResults>_>
                 .super__Head_base<0UL,_SDIOAnalyzerResults_*,_false>._M_head_impl,
                 (int)this->startOfNextFrame + ErrorDot,(Channel *)0x2);
      FrameV2::AddByteArray
                ((char *)(this->frameV2)._M_t.
                         super___uniq_ptr_impl<FrameV2,_std::default_delete<FrameV2>_>._M_t.
                         super__Tuple_impl<0UL,_FrameV2_*,_std::default_delete<FrameV2>_>.
                         super__Head_base<0UL,_FrameV2_*,_false>._M_head_impl,(uchar *)"ARG",
                 (ulonglong)this->data);
      uVar11 = local_30;
      UVar10 = this->expectedCRC;
      for (iVar15 = 0x18; uVar5 = uStack_28, -1 < iVar15; iVar15 = iVar15 + -8) {
        UVar10 = sdCRC7(UVar10,(U8)(uVar11 >> ((byte)iVar15 & 0x3f)));
      }
      this->expectedCRC = UVar10;
      for (iVar15 = 0x18; -1 < iVar15; iVar15 = iVar15 + -8) {
        UVar10 = sdCRC7(UVar10,(U8)(uVar5 >> ((byte)iVar15 & 0x3f)));
      }
      this->expectedCRC = UVar10;
      uVar12 = 0x100000005;
LAB_00106613:
      this->frameState = (int)uVar12;
      this->frameCounter = (int)((ulong)uVar12 >> 0x20);
      this->qwordLow = 0;
      goto LAB_00106622;
    }
    if (uVar7 == 0x3f) {
      this->qwordHigh = this->qwordLow;
      goto LAB_001062ed;
    }
    break;
  case 4:
    uVar11 = this->startOfNextFrame;
    if (this->lastFallingClockEdge < this->startOfNextFrame) {
      uVar11 = this->lastFallingClockEdge;
    }
    this->startOfNextFrame = uVar11;
    UVar3 = this->qwordLow;
    uVar7 = AnalyzerChannelData::GetBitState();
    uVar11 = (ulong)uVar7 | UVar3 * 2;
    this->qwordLow = uVar11;
    pUVar1 = &this->frameCounter;
    *pUVar1 = *pUVar1 - 1;
    if (*pUVar1 == 0) {
      this->qwordLow = (ulong)((uint)uVar11 & 0x7f);
      local_40 = this->startOfNextFrame;
      local_38 = AnalyzerChannelData::GetSampleOfNextEdge();
      local_1f = 0;
      local_30 = this->qwordLow;
      uStack_28 = (ulong)(local_30 == this->expectedCRC);
      local_20 = 4;
      AnalyzerResults::AddFrame
                ((Frame *)(this->mResults)._M_t.
                          super___uniq_ptr_impl<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_SDIOAnalyzerResults_*,_std::default_delete<SDIOAnalyzerResults>_>
                          .super__Head_base<0UL,_SDIOAnalyzerResults_*,_false>._M_head_impl);
      AnalyzerResults::AddMarker
                ((ulonglong)
                 (this->mResults)._M_t.
                 super___uniq_ptr_impl<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_SDIOAnalyzerResults_*,_std::default_delete<SDIOAnalyzerResults>_>
                 .super__Head_base<0UL,_SDIOAnalyzerResults_*,_false>._M_head_impl,
                 (int)this->startOfNextFrame + ErrorDot,(Channel *)(ulong)((uStack_28 == 0) + 6));
      FrameV2::AddByte((char *)(this->frameV2)._M_t.
                               super___uniq_ptr_impl<FrameV2,_std::default_delete<FrameV2>_>._M_t.
                               super__Tuple_impl<0UL,_FrameV2_*,_std::default_delete<FrameV2>_>.
                               super__Head_base<0UL,_FrameV2_*,_false>._M_head_impl,0xd6);
      FrameV2::AddBoolean((char *)(this->frameV2)._M_t.
                                  super___uniq_ptr_impl<FrameV2,_std::default_delete<FrameV2>_>._M_t
                                  .super__Tuple_impl<0UL,_FrameV2_*,_std::default_delete<FrameV2>_>.
                                  super__Head_base<0UL,_FrameV2_*,_false>._M_head_impl,true);
      this->endingSampleInclusive = local_38;
      this->frameState = 5;
LAB_001062ed:
      this->qwordLow = 0;
    }
    break;
  case 5:
    pSVar4 = (this->mResults)._M_t.
             super___uniq_ptr_impl<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>.
             _M_t.
             super__Tuple_impl<0UL,_SDIOAnalyzerResults_*,_std::default_delete<SDIOAnalyzerResults>_>
             .super__Head_base<0UL,_SDIOAnalyzerResults_*,_false>._M_head_impl;
    MVar9 = AnalyzerChannelData::GetSampleNumber();
    AnalyzerResults::AddMarker((ulonglong)pSVar4,MVar9,(Channel *)0x9);
    pcVar13 = "RESP";
    if (this->isCmd != false) {
      pcVar13 = "CMD";
    }
    AnalyzerResults::AddFrameV2
              ((FrameV2 *)
               (this->mResults)._M_t.
               super___uniq_ptr_impl<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>
               ._M_t.
               super__Tuple_impl<0UL,_SDIOAnalyzerResults_*,_std::default_delete<SDIOAnalyzerResults>_>
               .super__Head_base<0UL,_SDIOAnalyzerResults_*,_false>._M_head_impl,
               (char *)(this->frameV2)._M_t.
                       super___uniq_ptr_impl<FrameV2,_std::default_delete<FrameV2>_>._M_t.
                       super__Tuple_impl<0UL,_FrameV2_*,_std::default_delete<FrameV2>_>.
                       super__Head_base<0UL,_FrameV2_*,_false>._M_head_impl,(ulonglong)pcVar13,
               this->startingSampleInclusive);
    this_00 = (FrameV2 *)operator_new(8);
    FrameV2::FrameV2(this_00);
    std::__uniq_ptr_impl<FrameV2,_std::default_delete<FrameV2>_>::reset
              ((__uniq_ptr_impl<FrameV2,_std::default_delete<FrameV2>_> *)&this->frameV2,this_00);
    this->frameState = 0;
    bVar14 = true;
    goto LAB_0010662c;
  }
  bVar14 = false;
LAB_0010662c:
  Frame::~Frame((Frame *)&local_40);
  return bVar14;
}

Assistant:

bool SDIOAnalyzer::FrameStateMachine( void )
{
    Frame frame;
    bool done = false;
    U8 respLength;

    switch( frameState )
    {
    case TRANSMISSION_BIT:
        frame.mStartingSampleInclusive = lastFallingClockEdge;
        frame.mEndingSampleInclusive = mClock->GetSampleOfNextEdge();
        frame.mFlags = 0;
        frame.mData1 = mCmd->GetBitState();
        frame.mType = FRAME_DIR;
        mResults->AddFrame( frame );

        frameV2->AddBoolean( "DIR", frame.mData1 );
        startingSampleInclusive = frame.mStartingSampleInclusive;

        // The transmission bit tells us the origin of the packet
        // If the bit is high the packet comes from the host
        // If the bit is low, the packet comes from the slave
        isCmd = mCmd->GetBitState();

        mResults->AddMarker( lastFallingClockEdge, SDIOAnalyzerResults::MarkerType::Start, mSettings->mCmdChannel );
        if( isCmd )
        {
            mResults->AddMarker( mClock->GetSampleNumber(), SDIOAnalyzerResults::MarkerType::One, mSettings->mCmdChannel );
        }
        else
        {
            mResults->AddMarker( mClock->GetSampleNumber(), SDIOAnalyzerResults::MarkerType::Zero, mSettings->mCmdChannel );
        }

        frameState = COMMAND;
        frameCounter = 6;

        qwordLow = 0;
        lastCommand = 0;
        expectedCRC = 0;
        startOfNextFrame = UINT64_MAX;
        break;

    case COMMAND:
        startOfNextFrame = std::min( startOfNextFrame, lastFallingClockEdge );
        qwordLow = ( qwordLow << 1 ) | mCmd->GetBitState();
        frameCounter--;

        if( frameCounter == 0 )
        {
            frame.mStartingSampleInclusive = startOfNextFrame;
            frame.mEndingSampleInclusive = mClock->GetSampleOfNextEdge();
            frame.mFlags = 0;
            frame.mData1 = qwordLow & 0x3F;
            frame.mData2 = isCmd ? 1 : 0;
            frame.mType = FRAME_CMD;

            mResults->AddFrame( frame );
            mResults->AddMarker( startOfNextFrame + 1, SDIOAnalyzerResults::MarkerType::Dot, mSettings->mCmdChannel );

            frameV2->AddByte( "CMD", frame.mData1 );
            frameV2->AddBoolean( "DIR", frame.mData2 );

            expectedCRC = sdCRC7( 0, ( frame.mData2 << 6 ) | frame.mData1 );

            // Once we have the argument

            lastCommand = frame.mData1;

            // Find the expected length of the next response based on the command
            if( !isCmd && ( qwordLow == 2 || qwordLow == 9 || qwordLow == 10 ) )
            // CMD2, CMD9 and CMD10 respond with long R2 response
            {
                respLength = 127;
                frameState = LONG_ARGUMENT;
            }
            else
            {
                // All others have 48 bit responses
                respLength = 32;
                frameState = NORMAL_ARGUMENT;
            }

            byte = 0;
            qwordLow = 0;
            byteCounter = 0;
            frameCounter = respLength;
            startOfNextFrame = UINT64_MAX;
        }
        break;

    case NORMAL_ARGUMENT:
        startOfNextFrame = std::min( startOfNextFrame, lastFallingClockEdge );
        byte = byte << 1 | mCmd->GetBitState();
        qwordLow = ( qwordLow << 1 ) | mCmd->GetBitState();

        frameCounter--;

        if( ( frameCounter ) % 8 == 0 )
        {
            data[ byteCounter ] = byte;
            byteCounter++;
            byte = 0;
        }

        if( frameCounter == 0 )
        {
            frame.mStartingSampleInclusive = startOfNextFrame;
            frame.mEndingSampleInclusive = mClock->GetSampleOfNextEdge();
            frame.mFlags = lastCommand;
            frame.mData1 = qwordLow;
            frame.mType = FRAME_ARG;

            mResults->AddFrame( frame );
            mResults->AddMarker( startOfNextFrame + 1, SDIOAnalyzerResults::MarkerType::Square, mSettings->mCmdChannel );

            frameV2->AddByteArray( "ARG", data, 4 );

            for( signed int i = 24; i >= 0; i -= 8 )
                expectedCRC = sdCRC7( expectedCRC, 0xFF & ( frame.mData1 >> i ) );

            frameState = CRC7;
            frameCounter = 7;
            qwordLow = 0;
            startOfNextFrame = UINT64_MAX;
        }
        break;

    case LONG_ARGUMENT:
        startOfNextFrame = std::min( startOfNextFrame, lastFallingClockEdge );
        byte = byte << 1 | mCmd->GetBitState();
        qwordLow = ( qwordLow << 1 ) | mCmd->GetBitState();

        frameCounter--;

        if( frameCounter % 8 == 0 )
        {
            data[ byteCounter ] = byte;
        }

        if( frameCounter == 63 )
        {
            qwordHigh = qwordLow;
            qwordLow = 0;
        }

        if( frameCounter == 0 )
        {
            frame.mStartingSampleInclusive = startOfNextFrame;
            frame.mEndingSampleInclusive = mClock->GetSampleOfNextEdge();
            frame.mFlags = lastCommand;
            frame.mData1 = qwordHigh;
            frame.mData2 = qwordLow;
            frame.mType = FRAME_LONG_ARG;
            mResults->AddFrame( frame );
            mResults->AddMarker( startOfNextFrame + 1, SDIOAnalyzerResults::MarkerType::Square, mSettings->mCmdChannel );

            frameV2->AddByteArray( "ARG", data, 8 );

            for( signed int i = 24; i >= 0; i -= 8 )
                expectedCRC = sdCRC7( expectedCRC, 0xFF & ( frame.mData1 >> i ) );

            for( signed int i = 24; i >= 0; i -= 8 )
                expectedCRC = sdCRC7( expectedCRC, 0xFF & ( frame.mData2 >> i ) );

            frameState = STOP;
            frameCounter = 1;
            qwordLow = 0;
            startOfNextFrame = UINT64_MAX;
        }
        break;

    case CRC7:
        startOfNextFrame = std::min( startOfNextFrame, lastFallingClockEdge );
        qwordLow = qwordLow << 1 | mCmd->GetBitState();
        frameCounter--;

        if( frameCounter == 0 )
        {
            qwordLow &= 0x7F;

            frame.mStartingSampleInclusive = startOfNextFrame;
            frame.mEndingSampleInclusive = mClock->GetSampleOfNextEdge();
            frame.mFlags = 0;
            frame.mData1 = qwordLow;
            frame.mData2 = ( qwordLow == expectedCRC );
            frame.mType = FRAME_CRC;
            mResults->AddFrame( frame );

            if( frame.mData2 )
            {
                mResults->AddMarker( startOfNextFrame + 1, SDIOAnalyzerResults::MarkerType::X, mSettings->mCmdChannel );
            }
            else
            {
                mResults->AddMarker( startOfNextFrame + 1, SDIOAnalyzerResults::MarkerType::ErrorX, mSettings->mCmdChannel );
            }

            frameV2->AddByte( "CRC", frame.mData1 );
            frameV2->AddBoolean( "PASS", frame.mData2 );
            endingSampleInclusive = frame.mEndingSampleInclusive;

            frameState = STOP;
            qwordLow = 0;
        }
        break;

    case STOP:
        mResults->AddMarker( mClock->GetSampleNumber(), SDIOAnalyzerResults::MarkerType::Stop, mSettings->mCmdChannel );
        if( isCmd )
        {
            mResults->AddFrameV2( *frameV2, "CMD", startingSampleInclusive, endingSampleInclusive );
        }
        else
        {
            mResults->AddFrameV2( *frameV2, "RESP", startingSampleInclusive, endingSampleInclusive );
        }
        frameV2.reset( new FrameV2 );
        frameState = TRANSMISSION_BIT;
        done = true;

    default:
        break;
    }

    return done;
}